

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetServer.cpp
# Opt level: O1

VRDataQueue * __thiscall
MinVR::VRNetServer::syncEventDataAcrossAllNodes
          (VRDataQueue *__return_storage_ptr__,VRNetServer *this,VRDataQueue *eventQueue)

{
  int socketID;
  VRDataQueue *extraout_RDX;
  VRDataQueue *extraout_RDX_00;
  VRDataQueue *extraout_RDX_01;
  VRDataQueue *pVVar1;
  uint *puVar2;
  int *piVar3;
  serialData serializedEventQueue;
  serialData local_c8;
  VRDataQueue *local_a8;
  serialData local_a0;
  serialData local_80;
  _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  local_60;
  
  puVar2 = (uint *)(this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_a8 = __return_storage_ptr__;
  if (puVar2 < (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    pVVar1 = eventQueue;
    do {
      VRNetInterface::waitForAndReceiveEventData_abi_cxx11_
                (&local_c8,(VRNetInterface *)(ulong)*puVar2,(int)pVVar1);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_c8._M_dataplus._M_p,
                 local_c8._M_dataplus._M_p + local_c8._M_string_length);
      VRDataQueue::VRDataQueue((VRDataQueue *)&local_60,&local_80);
      VRDataQueue::addQueue(eventQueue,(VRDataQueue *)&local_60);
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::~_Rb_tree(&local_60);
      pVVar1 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        pVVar1 = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        pVVar1 = extraout_RDX_01;
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 < (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_finish);
  }
  VRDataQueue::serialize_abi_cxx11_(&local_c8,eventQueue);
  piVar3 = (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 < (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    do {
      socketID = *piVar3;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_c8._M_dataplus._M_p,
                 local_c8._M_dataplus._M_p + local_c8._M_string_length);
      VRNetInterface::sendEventData(socketID,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      piVar3 = piVar3 + 1;
    } while (piVar3 < (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_finish);
  }
  pVVar1 = local_a8;
  std::_Rb_tree_header::_Rb_tree_header
            (&(local_a8->_dataMap)._M_t._M_impl.super__Rb_tree_header,
             &(eventQueue->_dataMap)._M_t._M_impl.super__Rb_tree_header);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return pVVar1;
}

Assistant:

VRDataQueue VRNetServer::syncEventDataAcrossAllNodes(VRDataQueue eventQueue) {

  // TODO: rather than a for loop, could use a select() system call
  // here (I think) to figure out which socket is ready for a read in
  // the situation where one client is ready but other(s) are not
  for (std::vector<SOCKET>::iterator itr=_clientSocketFDs.begin();
       itr < _clientSocketFDs.end(); itr++) {
    VRDataQueue::serialData eventData = waitForAndReceiveEventData(*itr);

    eventQueue.addQueue(eventData);
  }

  VRDataQueue::serialData serializedEventQueue = eventQueue.serialize();
  // 2. send new combined inputEvents array out to all clients
  for (std::vector<SOCKET>::iterator itr=_clientSocketFDs.begin();
       itr < _clientSocketFDs.end(); itr++) {
    sendEventData(*itr, serializedEventQueue);
  }

  return eventQueue;
}